

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

bool __thiscall re2::Regexp::ComputeSimple(Regexp *this)

{
  bool bVar1;
  ostream *poVar2;
  byte local_1ca;
  byte local_1c9;
  LogMessage local_1a8;
  int local_24;
  Regexp **ppRStack_20;
  int i;
  Regexp **subs;
  Regexp *this_local;
  
  subs = (Regexp **)this;
  switch(this->op_) {
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x15':
    this_local._7_1_ = true;
    break;
  case '\x05':
  case '\x06':
    ppRStack_20 = sub(this);
    for (local_24 = 0; local_24 < (int)(uint)this->nsub_; local_24 = local_24 + 1) {
      bVar1 = simple(ppRStack_20[local_24]);
      if (!bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
    break;
  case '\a':
  case '\b':
  case '\t':
    ppRStack_20 = sub(this);
    bVar1 = simple(*ppRStack_20);
    if (bVar1) {
      if (((*ppRStack_20)->op_ - 1 < 2) || ((*ppRStack_20)->op_ - 7 < 3)) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case '\n':
    this_local._7_1_ = false;
    break;
  case '\v':
    ppRStack_20 = sub(this);
    this_local._7_1_ = simple(*ppRStack_20);
    break;
  case '\x14':
    if ((this->field_7).field_1.name_ == (string *)0x0) {
      bVar1 = CharClass::empty((this->field_7).field_3.cc_);
      local_1ca = 0;
      if (!bVar1) {
        bVar1 = CharClass::full((this->field_7).field_3.cc_);
        local_1ca = bVar1 ^ 0xff;
      }
      this_local._7_1_ = (bool)(local_1ca & 1);
    }
    else {
      bVar1 = CharClassBuilder::empty((this->field_7).field_3.ccb_);
      local_1c9 = 0;
      if (!bVar1) {
        bVar1 = CharClassBuilder::full((this->field_7).field_3.ccb_);
        local_1c9 = bVar1 ^ 0xff;
      }
      this_local._7_1_ = (bool)(local_1c9 & 1);
    }
    break;
  default:
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/simplify.cc",
               0x5f);
    poVar2 = LogMessage::stream(&local_1a8);
    poVar2 = std::operator<<(poVar2,"Case not handled in ComputeSimple: ");
    std::operator<<(poVar2,this->op_);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a8);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Regexp::ComputeSimple() {
  Regexp** subs;
  switch (op_) {
    case kRegexpNoMatch:
    case kRegexpEmptyMatch:
    case kRegexpLiteral:
    case kRegexpLiteralString:
    case kRegexpBeginLine:
    case kRegexpEndLine:
    case kRegexpBeginText:
    case kRegexpWordBoundary:
    case kRegexpNoWordBoundary:
    case kRegexpEndText:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
    case kRegexpHaveMatch:
      return true;
    case kRegexpConcat:
    case kRegexpAlternate:
      // These are simple as long as the subpieces are simple.
      subs = sub();
      for (int i = 0; i < nsub_; i++)
        if (!subs[i]->simple())
          return false;
      return true;
    case kRegexpCharClass:
      // Simple as long as the char class is not empty, not full.
      if (ccb_ != NULL)
        return !ccb_->empty() && !ccb_->full();
      return !cc_->empty() && !cc_->full();
    case kRegexpCapture:
      subs = sub();
      return subs[0]->simple();
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
      subs = sub();
      if (!subs[0]->simple())
        return false;
      switch (subs[0]->op_) {
        case kRegexpStar:
        case kRegexpPlus:
        case kRegexpQuest:
        case kRegexpEmptyMatch:
        case kRegexpNoMatch:
          return false;
        default:
          break;
      }
      return true;
    case kRegexpRepeat:
      return false;
  }
  LOG(DFATAL) << "Case not handled in ComputeSimple: " << op_;
  return false;
}